

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O3

bool __thiscall
DCanvas::ParseDrawTextureTags
          (DCanvas *this,FTexture *img,double x,double y,DWORD tag,__va_list_tag *tags,
          DrawParms *parms,bool fortext)

{
  ulong uVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  FRemapTable *pFVar4;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined8 uVar12;
  FRenderStyle FVar13;
  uint uVar14;
  int *piVar15;
  undefined8 *puVar16;
  FRenderStyle *pFVar17;
  uint32 *puVar18;
  long *plVar19;
  double *pdVar20;
  INTBOOL *pIVar21;
  bool bVar22;
  undefined3 in_register_00000089;
  int iVar23;
  DWORD *pDVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  
  if ((((CONCAT31(in_register_00000089,fortext) == 0) &&
       ((img == (FTexture *)0x0 || (img->UseType == '\r')))) || (16383.0 < y)) ||
     ((16383.0 < ABS(x) || (y < -16383.0)))) {
    return false;
  }
  parms->fortext = fortext;
  parms->windowleft = 0.0;
  parms->windowright = 2147483647.0;
  parms->uclip = 0;
  parms->lclip = 0;
  parms->top = 2147483647.0;
  parms->left = 2147483647.0;
  parms->destwidth = 2147483647.0;
  parms->destheight = 2147483647.0;
  parms->Alpha = 1.0;
  parms->fillcolor = 0xffffffff;
  uVar3 = this->Width;
  uVar5 = this->Height;
  parms->dclip = uVar5;
  parms->rclip = uVar3;
  parms->remap = (FRemapTable *)0x0;
  parms->colorOverlay = 0;
  parms->alphaChannel = 0;
  parms->alphaChannel = 0;
  parms->flipX = 0;
  parms->shadowAlpha = 0;
  parms->shadowColor = 0;
  dVar28 = (double)(int)uVar3;
  dVar30 = (double)(int)uVar5;
  parms->virtWidth = dVar28;
  parms->virtHeight = dVar30;
  parms->keepratio = 0;
  (parms->style).field_0.BlendOp = 0xff;
  parms->masked = 1;
  parms->bilinear = 0;
  parms->specialcolormap = (FSpecialColormap *)0x0;
  parms->colormapstyle = (FColormapStyle *)0x0;
  parms->cleanmode = 0x40001388;
  parms->scalex = 1;
  parms->scaley = 1;
  parms->cellx = 0;
  parms->celly = 0;
  parms->maxstrlen = 0x7fffffff;
  parms->virtBottom = false;
  bVar22 = false;
  do {
    switch(tag) {
    case 0x40001389:
      if (fortext) {
        __assert_fail("fortext == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                      ,0x1e2,
                      "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                     );
      }
      parms->cleanmode = 0x40001388;
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      dVar25 = (double)*piVar15;
      goto LAB_0048af8f;
    case 0x4000138a:
      if (fortext) {
        __assert_fail("fortext == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                      ,0x1f0,
                      "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                     );
      }
      parms->cleanmode = 0x40001388;
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      dVar25 = (double)*piVar15;
      goto LAB_0048b047;
    case 0x4000138b:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      iVar23 = 0x10000;
      if (*piVar15 < 0x10000) {
        iVar23 = *piVar15;
      }
      dVar25 = (double)iVar23 * 1.52587890625e-05;
      goto LAB_0048ad6d;
    case 0x4000138c:
      uVar14 = tags->fp_offset;
      if ((ulong)uVar14 < 0xa1) {
        pdVar20 = (double *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->fp_offset = uVar14 + 0x10;
      }
      else {
        pdVar20 = (double *)tags->overflow_arg_area;
        tags->overflow_arg_area = pdVar20 + 1;
      }
      dVar25 = 1.0;
      if (*pdVar20 <= 1.0) {
        dVar25 = *pdVar20;
      }
LAB_0048ad6d:
      parms->Alpha = (float)dVar25;
      break;
    case 0x4000138d:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        puVar18 = (uint32 *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        puVar18 = (uint32 *)tags->overflow_arg_area;
        tags->overflow_arg_area = puVar18 + 2;
      }
      parms->fillcolor = *puVar18;
      bVar22 = true;
      break;
    case 0x4000138e:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        plVar19 = (long *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        plVar19 = (long *)tags->overflow_arg_area;
        tags->overflow_arg_area = plVar19 + 1;
      }
      pFVar4 = (FRemapTable *)*plVar19;
      parms->remap = pFVar4;
      if ((pFVar4 != (FRemapTable *)0x0) && (pFVar4->Inactive == true)) {
        parms->remap = (FRemapTable *)0x0;
      }
      break;
    case 0x4000138f:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        pIVar21 = (INTBOOL *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        pIVar21 = (INTBOOL *)tags->overflow_arg_area;
        tags->overflow_arg_area = pIVar21 + 2;
      }
      parms->alphaChannel = *pIVar21;
      break;
    case 0x40001390:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      if (*piVar15 != 0) {
        parms->scalex = 1;
        parms->scaley = 1;
        parms->cleanmode = 0x40001390;
      }
      break;
    case 0x40001391:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      if (*piVar15 != 0) {
        parms->cleanmode = 0x40001388;
        parms->scalex = 1;
        parms->scaley = 1;
        auVar26 = _DAT_005e6b70;
LAB_0048abc1:
        parms->virtWidth = (double)auVar26._0_8_;
        parms->virtHeight = (double)auVar26._8_8_;
      }
      break;
    case 0x40001392:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      if (*piVar15 != 0) {
        parms->cleanmode = 0x40001388;
        parms->scalex = 1;
        parms->scaley = 1;
        uVar12 = _UNK_005e6b78;
        parms->virtWidth = (double)_DAT_005e6b70;
        parms->virtHeight = (double)uVar12;
      }
      parms->virtBottom = true;
      break;
    case 0x40001393:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      if (*piVar15 != 0) {
        parms->scalex = CleanXfac;
        parms->scaley = CleanYfac;
        parms->cleanmode = 0x40001393;
      }
      break;
    case 0x40001394:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      if (*piVar15 != 0) {
        parms->scalex = CleanXfac_1;
        parms->scaley = CleanYfac_1;
        parms->cleanmode = 0x40001394;
      }
      break;
    case 0x40001395:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        pIVar21 = (INTBOOL *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        pIVar21 = (INTBOOL *)tags->overflow_arg_area;
        tags->overflow_arg_area = pIVar21 + 2;
      }
      parms->flipX = *pIVar21;
      break;
    case 0x40001396:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      parms->shadowColor = *piVar15;
      break;
    case 0x40001397:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      iVar23 = 0x10000;
      if (*piVar15 < 0x10000) {
        iVar23 = *piVar15;
      }
      parms->shadowAlpha = iVar23;
      break;
    case 0x40001398:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      if (*piVar15 == 0) {
        parms->shadowAlpha = 0;
      }
      else {
        parms->shadowAlpha = 0x8000;
        parms->shadowColor = 0;
      }
      break;
    case 0x40001399:
      parms->cleanmode = 0x40001388;
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      dVar25 = (double)*piVar15;
      goto LAB_0048adad;
    case 0x4000139a:
      parms->cleanmode = 0x40001388;
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      dVar25 = (double)*piVar15;
      goto LAB_0048ae97;
    case 0x4000139b:
      if (fortext) {
        __assert_fail("fortext == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                      ,0x27b,
                      "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                     );
      }
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      dVar25 = (double)*piVar15;
      goto LAB_0048b019;
    case 0x4000139c:
      if (fortext) {
        __assert_fail("fortext == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                      ,0x287,
                      "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                     );
      }
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      dVar25 = (double)*piVar15;
      goto LAB_0048afed;
    case 0x4000139d:
      if (fortext) {
        __assert_fail("fortext == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                      ,0x293,
                      "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                     );
      }
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      if (*piVar15 != 0) {
        uVar2._0_2_ = img->Width;
        uVar2._2_2_ = img->Height;
        uVar2._4_2_ = img->WidthMask;
        uVar2._6_2_ = *(undefined2 *)&img->field_0x3e;
        auVar7._8_4_ = 0;
        auVar7._0_8_ = uVar2;
        auVar7._12_2_ = uVar2._6_2_;
        auVar9._8_2_ = uVar2._4_2_;
        auVar9._0_8_ = uVar2;
        auVar9._10_4_ = auVar7._10_4_;
        auVar11._6_8_ = 0;
        auVar11._0_6_ = auVar9._8_6_;
        auVar27._0_8_ = (double)(ushort)(undefined2)uVar2;
        auVar27._8_8_ = (double)(int)CONCAT82(SUB148(auVar11 << 0x40,6),uVar2._2_2_);
        auVar26 = divpd(auVar27,(undefined1  [16])img->Scale);
        dVar29 = auVar26._8_8_ * 0.5;
        dVar31 = auVar26._0_8_ * 0.5;
        parms->top = dVar29;
        parms->left = dVar31;
      }
      break;
    case 0x4000139e:
      if (fortext) {
        __assert_fail("fortext == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                      ,0x29d,
                      "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                     );
      }
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      if (*piVar15 != 0) {
        parms->left = ((double)img->Width / (img->Scale).X) * 0.5;
        dVar25 = (double)img->Height / (img->Scale).Y;
        goto LAB_0048b019;
      }
      break;
    case 0x4000139f:
      if (fortext) {
        __assert_fail("fortext == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                      ,0x2a7,
                      "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                     );
      }
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      dVar25 = (double)*piVar15;
      goto LAB_0048b030;
    case 0x400013a0:
      if (fortext) {
        __assert_fail("fortext == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                      ,0x2b3,
                      "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                     );
      }
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      dVar25 = (double)*piVar15;
      goto LAB_0048af72;
    case 0x400013a1:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      iVar23 = 0;
      if (0 < *piVar15) {
        iVar23 = *piVar15;
      }
      parms->uclip = iVar23;
      break;
    case 0x400013a2:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      iVar23 = this->Height;
      if (*piVar15 < this->Height) {
        iVar23 = *piVar15;
      }
      parms->dclip = iVar23;
      break;
    case 0x400013a3:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      iVar23 = 0;
      if (0 < *piVar15) {
        iVar23 = *piVar15;
      }
      parms->lclip = iVar23;
      break;
    case 0x400013a4:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      iVar23 = this->Width;
      if (*piVar15 < this->Width) {
        iVar23 = *piVar15;
      }
      parms->rclip = iVar23;
      break;
    case 0x400013a5:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        pIVar21 = (INTBOOL *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        pIVar21 = (INTBOOL *)tags->overflow_arg_area;
        tags->overflow_arg_area = pIVar21 + 2;
      }
      parms->masked = *pIVar21;
      break;
    case 0x400013a6:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      parms->cleanmode = *piVar15 == 1 | 0x400013a6;
      break;
    case 0x400013a7:
      goto switchD_0048a2ee_caseD_400013a7;
    case 0x400013a8:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        pIVar21 = (INTBOOL *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        pIVar21 = (INTBOOL *)tags->overflow_arg_area;
        tags->overflow_arg_area = pIVar21 + 2;
      }
      parms->keepratio = *pIVar21;
      break;
    case 0x400013a9:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        pFVar17 = (FRenderStyle *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        pFVar17 = (FRenderStyle *)tags->overflow_arg_area;
        tags->overflow_arg_area = pFVar17 + 2;
      }
      parms->style = *pFVar17;
      break;
    case 0x400013aa:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        puVar18 = (uint32 *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        puVar18 = (uint32 *)tags->overflow_arg_area;
        tags->overflow_arg_area = puVar18 + 2;
      }
      parms->colorOverlay = *puVar18;
      break;
    case 0x400013ab:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        pIVar21 = (INTBOOL *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        pIVar21 = (INTBOOL *)tags->overflow_arg_area;
        tags->overflow_arg_area = pIVar21 + 2;
      }
      parms->bilinear = *pIVar21;
      break;
    case 0x400013ac:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        puVar16 = (undefined8 *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        puVar16 = (undefined8 *)tags->overflow_arg_area;
        tags->overflow_arg_area = puVar16 + 1;
      }
      parms->specialcolormap = (FSpecialColormap *)*puVar16;
      break;
    case 0x400013ad:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        puVar16 = (undefined8 *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        puVar16 = (undefined8 *)tags->overflow_arg_area;
        tags->overflow_arg_area = puVar16 + 1;
      }
      parms->colormapstyle = (FColormapStyle *)*puVar16;
      break;
    case 0x400013ae:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      if (*piVar15 != 0) {
        if (fortext) {
          __assert_fail("fortext == false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                        ,0x251,
                        "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                       );
        }
        if (img == (FTexture *)0x0) {
          return false;
        }
        parms->cleanmode = 0x400013ae;
        uVar1._0_2_ = img->Width;
        uVar1._2_2_ = img->Height;
        uVar1._4_2_ = img->WidthMask;
        uVar1._6_2_ = *(undefined2 *)&img->field_0x3e;
        auVar6._8_4_ = 0;
        auVar6._0_8_ = uVar1;
        auVar6._12_2_ = uVar1._6_2_;
        auVar8._8_2_ = uVar1._4_2_;
        auVar8._0_8_ = uVar1;
        auVar8._10_4_ = auVar6._10_4_;
        auVar10._6_8_ = 0;
        auVar10._0_6_ = auVar8._8_6_;
        auVar26._0_8_ = (double)(ushort)(undefined2)uVar1;
        auVar26._8_8_ = (double)(int)CONCAT82(SUB148(auVar10 << 0x40,6),uVar1._2_2_);
        auVar26 = divpd(auVar26,(undefined1  [16])img->Scale);
        goto LAB_0048abc1;
      }
      break;
    case 0x400013af:
      if (fortext) {
        __assert_fail("fortext == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                      ,0x1e9,
                      "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                     );
      }
      parms->cleanmode = 0x40001388;
      uVar14 = tags->fp_offset;
      if ((ulong)uVar14 < 0xa1) {
        pdVar20 = (double *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->fp_offset = uVar14 + 0x10;
      }
      else {
        pdVar20 = (double *)tags->overflow_arg_area;
        tags->overflow_arg_area = pdVar20 + 1;
      }
      dVar25 = *pdVar20;
LAB_0048af8f:
      parms->destwidth = dVar25;
      break;
    case 0x400013b0:
      if (fortext) {
        __assert_fail("fortext == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                      ,0x1f7,
                      "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                     );
      }
      parms->cleanmode = 0x40001388;
      uVar14 = tags->fp_offset;
      if ((ulong)uVar14 < 0xa1) {
        pdVar20 = (double *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->fp_offset = uVar14 + 0x10;
      }
      else {
        pdVar20 = (double *)tags->overflow_arg_area;
        tags->overflow_arg_area = pdVar20 + 1;
      }
      dVar25 = *pdVar20;
LAB_0048b047:
      parms->destheight = dVar25;
      break;
    case 0x400013b1:
      if (fortext) {
        __assert_fail("fortext == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                      ,0x281,
                      "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                     );
      }
      uVar14 = tags->fp_offset;
      if ((ulong)uVar14 < 0xa1) {
        pdVar20 = (double *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->fp_offset = uVar14 + 0x10;
      }
      else {
        pdVar20 = (double *)tags->overflow_arg_area;
        tags->overflow_arg_area = pdVar20 + 1;
      }
      dVar25 = *pdVar20;
LAB_0048b019:
      parms->top = dVar25;
      break;
    case 0x400013b2:
      if (fortext) {
        __assert_fail("fortext == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                      ,0x28d,
                      "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                     );
      }
      uVar14 = tags->fp_offset;
      if ((ulong)uVar14 < 0xa1) {
        pdVar20 = (double *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->fp_offset = uVar14 + 0x10;
      }
      else {
        pdVar20 = (double *)tags->overflow_arg_area;
        tags->overflow_arg_area = pdVar20 + 1;
      }
      dVar25 = *pdVar20;
LAB_0048afed:
      parms->left = dVar25;
      break;
    case 0x400013b3:
      parms->cleanmode = 0x40001388;
      uVar14 = tags->fp_offset;
      if ((ulong)uVar14 < 0xa1) {
        pdVar20 = (double *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->fp_offset = uVar14 + 0x10;
      }
      else {
        pdVar20 = (double *)tags->overflow_arg_area;
        tags->overflow_arg_area = pdVar20 + 1;
      }
      dVar25 = *pdVar20;
LAB_0048adad:
      parms->virtWidth = dVar25;
      break;
    case 0x400013b4:
      parms->cleanmode = 0x40001388;
      uVar14 = tags->fp_offset;
      if ((ulong)uVar14 < 0xa1) {
        pdVar20 = (double *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->fp_offset = uVar14 + 0x10;
      }
      else {
        pdVar20 = (double *)tags->overflow_arg_area;
        tags->overflow_arg_area = pdVar20 + 1;
      }
      dVar25 = *pdVar20;
LAB_0048ae97:
      parms->virtHeight = dVar25;
      break;
    case 0x400013b5:
      if (fortext) {
        __assert_fail("fortext == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                      ,0x2ad,
                      "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                     );
      }
      uVar14 = tags->fp_offset;
      if ((ulong)uVar14 < 0xa1) {
        pdVar20 = (double *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->fp_offset = uVar14 + 0x10;
      }
      else {
        pdVar20 = (double *)tags->overflow_arg_area;
        tags->overflow_arg_area = pdVar20 + 1;
      }
      dVar25 = *pdVar20;
LAB_0048b030:
      parms->windowleft = dVar25;
      break;
    case 0x400013b6:
      if (fortext) {
        __assert_fail("fortext == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                      ,0x2b9,
                      "bool DCanvas::ParseDrawTextureTags(FTexture *, double, double, DWORD, __va_list_tag *, DrawParms *, bool) const"
                     );
      }
      uVar14 = tags->fp_offset;
      if ((ulong)uVar14 < 0xa1) {
        pdVar20 = (double *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->fp_offset = uVar14 + 0x10;
      }
      else {
        pdVar20 = (double *)tags->overflow_arg_area;
        tags->overflow_arg_area = pdVar20 + 1;
      }
      dVar25 = *pdVar20;
LAB_0048af72:
      parms->windowright = dVar25;
      break;
    case 0x400013b7:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      parms->maxstrlen = *piVar15;
      break;
    case 0x400013b8:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      parms->cellx = *piVar15;
      break;
    case 0x400013b9:
      uVar14 = tags->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        piVar15 = (int *)((ulong)uVar14 + (long)tags->reg_save_area);
        tags->gp_offset = uVar14 + 8;
      }
      else {
        piVar15 = (int *)tags->overflow_arg_area;
        tags->overflow_arg_area = piVar15 + 2;
      }
      parms->celly = *piVar15;
      break;
    default:
      if (tag == 0) {
        if (parms->dclip <= parms->uclip) {
          return false;
        }
        if (parms->rclip <= parms->lclip) {
          return false;
        }
        if (img != (FTexture *)0x0) {
          SetTextureParms(this,parms,img,x,y);
          if (parms->destwidth <= 0.0) {
            return false;
          }
          if (parms->destheight <= 0.0) {
            return false;
          }
        }
        if ((parms->style).field_0.BlendOp == 0xff) {
          if (bVar22) {
            FVar13 = LegacyRenderStyles[8];
            if ((parms->alphaChannel == 0) &&
               (FVar13 = LegacyRenderStyles[5], parms->Alpha <= 1.0 && parms->Alpha != 1.0)) {
              FVar13 = LegacyRenderStyles[9];
            }
          }
          else {
            FVar13 = LegacyRenderStyles[1];
            if (parms->Alpha <= 1.0 && parms->Alpha != 1.0) {
              FVar13 = LegacyRenderStyles[6];
            }
          }
          parms->style = FVar13;
          return true;
        }
        return true;
      }
switchD_0048a2ee_caseD_400013a7:
      if (0x28 < tags->gp_offset) {
        tags->overflow_arg_area = (void *)((long)tags->overflow_arg_area + 8);
        break;
      }
      uVar14 = tags->gp_offset + 8;
      tags->gp_offset = uVar14;
      goto LAB_0048b04e;
    }
    uVar14 = tags->gp_offset;
LAB_0048b04e:
    if (uVar14 < 0x29) {
      pDVar24 = (DWORD *)((ulong)uVar14 + (long)tags->reg_save_area);
      tags->gp_offset = uVar14 + 8;
    }
    else {
      pDVar24 = (DWORD *)tags->overflow_arg_area;
      tags->overflow_arg_area = pDVar24 + 2;
    }
    tag = *pDVar24;
  } while( true );
}

Assistant:

bool DCanvas::ParseDrawTextureTags (FTexture *img, double x, double y, DWORD tag, va_list tags, DrawParms *parms, bool fortext) const
{
	INTBOOL boolval;
	int intval;
	bool translationset = false;
	bool fillcolorset = false;

	if (!fortext)
	{
		if (img == NULL || img->UseType == FTexture::TEX_Null)
		{
			va_end(tags);
			return false;
		}
	}

	// Do some sanity checks on the coordinates.
	if (x < -16383 || x > 16383 || y < -16383 || y > 16383)
	{
		va_end(tags);
		return false;
	}

	parms->fortext = fortext;
	parms->windowleft = 0;
	parms->windowright = INT_MAX;
	parms->dclip = this->GetHeight();
	parms->uclip = 0;
	parms->lclip = 0;
	parms->rclip = this->GetWidth();
	parms->left = INT_MAX;
	parms->top = INT_MAX;
	parms->destwidth = INT_MAX;
	parms->destheight = INT_MAX;
	parms->Alpha = 1.f;
	parms->fillcolor = -1;
	parms->remap = NULL;
	parms->colorOverlay = 0;
	parms->alphaChannel = false;
	parms->flipX = false;
	parms->shadowAlpha = 0;
	parms->shadowColor = 0;
	parms->virtWidth = this->GetWidth();
	parms->virtHeight = this->GetHeight();
	parms->keepratio = false;
	parms->style.BlendOp = 255;		// Dummy "not set" value
	parms->masked = true;
	parms->bilinear = false;
	parms->specialcolormap = NULL;
	parms->colormapstyle = NULL;
	parms->cleanmode = DTA_Base;
	parms->scalex = parms->scaley = 1;
	parms->cellx = parms->celly = 0;
	parms->maxstrlen = INT_MAX;
	parms->virtBottom = false;

	// Parse the tag list for attributes. (For floating point attributes,
	// consider that the C ABI dictates that all floats be promoted to
	// doubles when passed as function arguments.)
	while (tag != TAG_DONE)
	{
		DWORD data;

		switch (tag)
		{
		default:
			data = va_arg(tags, DWORD);
			break;

		case DTA_DestWidth:
			assert(fortext == false);
			if (fortext) return false;
			parms->cleanmode = DTA_Base;
			parms->destwidth = va_arg(tags, int);
			break;

		case DTA_DestWidthF:
			assert(fortext == false);
			if (fortext) return false;
			parms->cleanmode = DTA_Base;
			parms->destwidth = va_arg(tags, double);
			break;

		case DTA_DestHeight:
			assert(fortext == false);
			if (fortext) return false;
			parms->cleanmode = DTA_Base;
			parms->destheight = va_arg(tags, int);
			break;

		case DTA_DestHeightF:
			assert(fortext == false);
			if (fortext) return false;
			parms->cleanmode = DTA_Base;
			parms->destheight = va_arg(tags, double);
			break;

		case DTA_Clean:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->scalex = 1;
				parms->scaley = 1;
				parms->cleanmode = tag;
			}
			break;

		case DTA_CleanNoMove:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->scalex = CleanXfac;
				parms->scaley = CleanYfac;
				parms->cleanmode = tag;
			}
			break;

		case DTA_CleanNoMove_1:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->scalex = CleanXfac_1;
				parms->scaley = CleanYfac_1;
				parms->cleanmode = tag;
			}
			break;

		case DTA_320x200:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->cleanmode = DTA_Base;
				parms->scalex = 1;
				parms->scaley = 1;
				parms->virtWidth = 320;
				parms->virtHeight = 200;
			}
			break;

		case DTA_Bottom320x200:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->cleanmode = DTA_Base;
				parms->scalex = 1;
				parms->scaley = 1;
				parms->virtWidth = 320;
				parms->virtHeight = 200;
			}
			parms->virtBottom = true;
			break;

		case DTA_HUDRules:
			intval = va_arg(tags, int);
			parms->cleanmode = intval == HUD_HorizCenter ? DTA_HUDRulesC : DTA_HUDRules;
			break;

		case DTA_VirtualWidth:
			parms->cleanmode = DTA_Base;
			parms->virtWidth = va_arg(tags, int);
			break;

		case DTA_VirtualWidthF:
			parms->cleanmode = DTA_Base;
			parms->virtWidth = va_arg(tags, double);
			break;
			
		case DTA_VirtualHeight:
			parms->cleanmode = DTA_Base;
			parms->virtHeight = va_arg(tags, int);
			break;

		case DTA_VirtualHeightF:
			parms->cleanmode = DTA_Base;
			parms->virtHeight = va_arg(tags, double);
			break;

		case DTA_Fullscreen:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				assert(fortext == false);
				if (img == NULL) return false;
				parms->cleanmode = DTA_Fullscreen;
				parms->virtWidth = img->GetScaledWidthDouble();
				parms->virtHeight = img->GetScaledHeightDouble();
			}
			break;

		case DTA_Alpha:
			parms->Alpha = FIXED2FLOAT(MIN<fixed_t>(OPAQUE, va_arg (tags, fixed_t)));
			break;

		case DTA_AlphaF:
			parms->Alpha = (float)(MIN<double>(1., va_arg(tags, double)));
			break;

		case DTA_AlphaChannel:
			parms->alphaChannel = va_arg(tags, INTBOOL);
			break;

		case DTA_FillColor:
			parms->fillcolor = va_arg(tags, uint32);
			fillcolorset = true;
			break;

		case DTA_Translation:
			parms->remap = va_arg(tags, FRemapTable *);
			if (parms->remap != NULL && parms->remap->Inactive)
			{ // If it's inactive, pretend we were passed NULL instead.
				parms->remap = NULL;
			}
			break;

		case DTA_ColorOverlay:
			parms->colorOverlay = va_arg(tags, DWORD);
			break;

		case DTA_FlipX:
			parms->flipX = va_arg(tags, INTBOOL);
			break;

		case DTA_TopOffset:
			assert(fortext == false);
			if (fortext) return false;
			parms->top = va_arg(tags, int);
			break;

		case DTA_TopOffsetF:
			assert(fortext == false);
			if (fortext) return false;
			parms->top = va_arg(tags, double);
			break;

		case DTA_LeftOffset:
			assert(fortext == false);
			if (fortext) return false;
			parms->left = va_arg(tags, int);
			break;

		case DTA_LeftOffsetF:
			assert(fortext == false);
			if (fortext) return false;
			parms->left = va_arg(tags, double);
			break;

		case DTA_CenterOffset:
			assert(fortext == false);
			if (fortext) return false;
			if (va_arg(tags, int))
			{
				parms->left = img->GetScaledWidthDouble() * 0.5;
				parms->top = img->GetScaledHeightDouble() * 0.5;
			}
			break;

		case DTA_CenterBottomOffset:
			assert(fortext == false);
			if (fortext) return false;
			if (va_arg(tags, int))
			{
				parms->left = img->GetScaledWidthDouble() * 0.5;
				parms->top = img->GetScaledHeightDouble();
			}
			break;

		case DTA_WindowLeft:
			assert(fortext == false);
			if (fortext) return false;
			parms->windowleft = va_arg(tags, int);
			break;

		case DTA_WindowLeftF:
			assert(fortext == false);
			if (fortext) return false;
			parms->windowleft = va_arg(tags, double);
			break;

		case DTA_WindowRight:
			assert(fortext == false);
			if (fortext) return false;
			parms->windowright = va_arg(tags, int);
			break;

		case DTA_WindowRightF:
			assert(fortext == false);
			if (fortext) return false;
			parms->windowright = va_arg(tags, double);
			break;

		case DTA_ClipTop:
			parms->uclip = va_arg(tags, int);
			if (parms->uclip < 0)
			{
				parms->uclip = 0;
			}
			break;

		case DTA_ClipBottom:
			parms->dclip = va_arg(tags, int);
			if (parms->dclip > this->GetHeight())
			{
				parms->dclip = this->GetHeight();
			}
			break;

		case DTA_ClipLeft:
			parms->lclip = va_arg(tags, int);
			if (parms->lclip < 0)
			{
				parms->lclip = 0;
			}
			break;

		case DTA_ClipRight:
			parms->rclip = va_arg(tags, int);
			if (parms->rclip > this->GetWidth())
			{
				parms->rclip = this->GetWidth();
			}
			break;

		case DTA_ShadowAlpha:
			parms->shadowAlpha = MIN<fixed_t>(OPAQUE, va_arg (tags, fixed_t));
			break;

		case DTA_ShadowColor:
			parms->shadowColor = va_arg(tags, int);
			break;

		case DTA_Shadow:
			boolval = va_arg(tags, INTBOOL);
			if (boolval)
			{
				parms->shadowAlpha = FRACUNIT/2;
				parms->shadowColor = 0;
			}
			else
			{
				parms->shadowAlpha = 0;
			}
			break;

		case DTA_Masked:
			parms->masked = va_arg(tags, INTBOOL);
			break;

		case DTA_BilinearFilter:
			parms->bilinear = va_arg(tags, INTBOOL);
			break;

		case DTA_KeepRatio:
			// I think this is a terribly misleading name, since it actually turns
			// *off* aspect ratio correction.
			parms->keepratio = va_arg(tags, INTBOOL);
			break;

		case DTA_RenderStyle:
			parms->style.AsDWORD = va_arg(tags, DWORD);
			break;

		case DTA_SpecialColormap:
			parms->specialcolormap = va_arg(tags, FSpecialColormap *);
			break;

		case DTA_ColormapStyle:
			parms->colormapstyle = va_arg(tags, FColormapStyle *);
			break;

		case DTA_TextLen:
			parms->maxstrlen = va_arg(tags, int);
			break;

		case DTA_CellX:
			parms->cellx = va_arg(tags, int);
			break;

		case DTA_CellY:
			parms->celly = va_arg(tags, int);
			break;

		}
		tag = va_arg(tags, DWORD);
	}
	va_end (tags);

	if (parms->uclip >= parms->dclip || parms->lclip >= parms->rclip)
	{
		return false;
	}

	if (img != NULL)
	{
		SetTextureParms(parms, img, x, y);

		if (parms->destwidth <= 0 || parms->destheight <= 0)
		{
			return false;
		}
	}

	if (parms->style.BlendOp == 255)
	{
		if (fillcolorset)
		{
			if (parms->alphaChannel)
			{
				parms->style = STYLE_Shaded;
			}
			else if (parms->Alpha < 1.f)
			{
				parms->style = STYLE_TranslucentStencil;
			}
			else
			{
				parms->style = STYLE_Stencil;
			}
		}
		else if (parms->Alpha < 1.f)
		{
			parms->style = STYLE_Translucent;
		}
		else
		{
			parms->style = STYLE_Normal;
		}
	}
	return true;
}